

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_get_asn1_int64_with_tag(CBS *cbs,int64_t *out,CBS_ASN1_TAG tag)

{
  uint8_t uVar1;
  int iVar2;
  CBS bytes;
  uint8_t sign_extend [8];
  CBS local_28;
  ulong local_18;
  
  iVar2 = cbs_get_asn1(cbs,&local_28,tag,1);
  if (iVar2 == 0) {
    return 0;
  }
  if (local_28.len == 0) {
    return 0;
  }
  uVar1 = *local_28.data;
  if (local_28.len != 1) {
    if (uVar1 == '\0' && -1 < (char)local_28.data[1]) {
      return 0;
    }
    if (8 < local_28.len) {
      return 0;
    }
    if (uVar1 == 0xff && (char)local_28.data[1] < '\0') {
      return 0;
    }
  }
  local_18 = (ulong)(byte)((char)uVar1 >> 7) * 0x101010101010101;
  memcpy(&stack0xfffffffffffffff0 + -local_28.len,local_28.data,local_28.len);
  *out = local_18 >> 0x38 | (local_18 & 0xff000000000000) >> 0x28 |
         (local_18 & 0xff0000000000) >> 0x18 | (local_18 & 0xff00000000) >> 8 |
         (local_18 & 0xff000000) << 8 | (local_18 & 0xff0000) << 0x18 | (local_18 & 0xff00) << 0x28
         | local_18 << 0x38;
  return 1;
}

Assistant:

int CBS_get_asn1_int64_with_tag(CBS *cbs, int64_t *out, CBS_ASN1_TAG tag) {
  int is_negative;
  CBS bytes;
  if (!CBS_get_asn1(cbs, &bytes, tag) ||
      !CBS_is_valid_asn1_integer(&bytes, &is_negative)) {
    return 0;
  }
  const uint8_t *data = CBS_data(&bytes);
  const size_t len = CBS_len(&bytes);
  if (len > sizeof(int64_t)) {
    return 0;
  }
  uint8_t sign_extend[sizeof(int64_t)];
  OPENSSL_memset(sign_extend, is_negative ? 0xff : 0, sizeof(sign_extend));
  OPENSSL_memcpy(sign_extend + sizeof(int64_t) - len, data, len);
  *out = CRYPTO_load_u64_be(sign_extend);
  return 1;
}